

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcOdc.c
# Opt level: O3

void Abc_NtkDontCareWinCollectRoots_rec(Abc_Obj_t *pObj,Vec_Ptr_t *vRoots)

{
  size_t __size;
  int iVar1;
  Abc_Ntk_t *pAVar2;
  long *plVar3;
  long lVar4;
  int iVar5;
  void **ppvVar6;
  long lVar7;
  int in_EDX;
  long extraout_RDX;
  long lVar8;
  
  if ((*(uint *)&pObj->field_0x14 & 0xf) != 7) {
    __assert_fail("Abc_ObjIsNode(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcOdc.c"
                  ,0x170,"void Abc_NtkDontCareWinCollectRoots_rec(Abc_Obj_t *, Vec_Ptr_t *)");
  }
  pAVar2 = pObj->pNtk;
  iVar5 = pObj->Id;
  Vec_IntFillExtra(&pAVar2->vTravIds,iVar5 + 1,in_EDX);
  if ((-1 < (long)iVar5) && (iVar5 < (pAVar2->vTravIds).nSize)) {
    if ((pAVar2->vTravIds).pArray[iVar5] != pObj->pNtk->nTravIds) {
      __assert_fail("Abc_NodeIsTravIdCurrent(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcOdc.c"
                    ,0x171,"void Abc_NtkDontCareWinCollectRoots_rec(Abc_Obj_t *, Vec_Ptr_t *)");
    }
    iVar5 = (pObj->vFanouts).nSize;
    lVar8 = 0;
    lVar7 = extraout_RDX;
    if (0 < iVar5) {
      do {
        plVar3 = (long *)pObj->pNtk->vObjs->pArray[(pObj->vFanouts).pArray[lVar8]];
        lVar4 = *plVar3;
        iVar1 = (int)plVar3[2];
        Vec_IntFillExtra((Vec_Int_t *)(lVar4 + 0xe0),iVar1 + 1,(int)lVar7);
        if (((long)iVar1 < 0) || (*(int *)(lVar4 + 0xe4) <= iVar1)) goto LAB_0087fe64;
        lVar7 = *plVar3;
        iVar5 = (pObj->vFanouts).nSize;
      } while ((*(int *)(*(long *)(lVar4 + 0xe8) + (long)iVar1 * 4) == *(int *)(lVar7 + 0xd8)) &&
              (lVar8 = lVar8 + 1, lVar8 < iVar5));
    }
    if ((int)lVar8 < iVar5) {
      iVar5 = vRoots->nSize;
      if (0 < (long)iVar5) {
        lVar7 = 0;
        do {
          if ((Abc_Obj_t *)vRoots->pArray[lVar7] == pObj) {
            return;
          }
          lVar7 = lVar7 + 1;
        } while (iVar5 != lVar7);
      }
      if (iVar5 == vRoots->nCap) {
        if (iVar5 < 0x10) {
          if (vRoots->pArray == (void **)0x0) {
            ppvVar6 = (void **)malloc(0x80);
          }
          else {
            ppvVar6 = (void **)realloc(vRoots->pArray,0x80);
          }
          vRoots->pArray = ppvVar6;
          vRoots->nCap = 0x10;
        }
        else {
          __size = (ulong)(uint)(iVar5 * 2) * 8;
          if (vRoots->pArray == (void **)0x0) {
            ppvVar6 = (void **)malloc(__size);
          }
          else {
            ppvVar6 = (void **)realloc(vRoots->pArray,__size);
          }
          vRoots->pArray = ppvVar6;
          vRoots->nCap = iVar5 * 2;
        }
      }
      else {
        ppvVar6 = vRoots->pArray;
      }
      iVar5 = vRoots->nSize;
      vRoots->nSize = iVar5 + 1;
      ppvVar6[iVar5] = pObj;
    }
    else if (0 < iVar5) {
      lVar7 = 0;
      do {
        Abc_NtkDontCareWinCollectRoots_rec
                  ((Abc_Obj_t *)pObj->pNtk->vObjs->pArray[(pObj->vFanouts).pArray[lVar7]],vRoots);
        lVar7 = lVar7 + 1;
      } while (lVar7 < (pObj->vFanouts).nSize);
    }
    return;
  }
LAB_0087fe64:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

void Abc_NtkDontCareWinCollectRoots_rec( Abc_Obj_t * pObj, Vec_Ptr_t * vRoots )
{
    Abc_Obj_t * pFanout;
    int i;
    assert( Abc_ObjIsNode(pObj) );
    assert( Abc_NodeIsTravIdCurrent(pObj) );
    // check if the node has all fanouts marked
    Abc_ObjForEachFanout( pObj, pFanout, i )
        if ( !Abc_NodeIsTravIdCurrent(pFanout) )
            break;
    // if some of the fanouts are unmarked, add the node to the root
    if ( i < Abc_ObjFanoutNum(pObj) ) 
    {
        Vec_PtrPushUnique( vRoots, pObj );
        return;
    }
    // otherwise, call recursively
    Abc_ObjForEachFanout( pObj, pFanout, i )
        Abc_NtkDontCareWinCollectRoots_rec( pFanout, vRoots );
}